

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

bool __thiscall
cmGlobalGhsMultiGenerator::ComputeTargetBuildOrder
          (cmGlobalGhsMultiGenerator *this,cmGeneratorTarget *tgt,
          vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *build)

{
  bool bVar1;
  initializer_list<const_cmGeneratorTarget_*> __l;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> t;
  allocator_type local_39;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> local_38;
  cmGeneratorTarget *local_20;
  
  __l._M_len = 1;
  __l._M_array = &local_20;
  local_20 = tgt;
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::vector
            (&local_38,__l,&local_39);
  bVar1 = ComputeTargetBuildOrder(this,&local_38,build);
  if (local_38.
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool cmGlobalGhsMultiGenerator::ComputeTargetBuildOrder(
  cmGeneratorTarget const* tgt, std::vector<cmGeneratorTarget const*>& build)
{
  std::vector<cmGeneratorTarget const*> t{ tgt };
  return this->ComputeTargetBuildOrder(t, build);
}